

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O2

void __thiscall
estl::
vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
vector_s(vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
         *this,vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
               *other)

{
  long lVar1;
  size_type sVar2;
  bool bVar3;
  
  this->size_ = 0;
  this->data_ptr_ = (pointer)this->data_;
  sVar2 = other->size_;
  lVar1 = sVar2 << 5;
  while( true ) {
    bVar3 = sVar2 == 0;
    sVar2 = sVar2 - 1;
    if (bVar3) break;
    std::__cxx11::string::string
              ((string *)((long)&this->data_ptr_[-1]._M_dataplus._M_p + lVar1),
               (string *)((long)&other->data_ptr_[-1]._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  }
  this->size_ = other->size_;
  return;
}

Assistant:

vector_s( vector_s&& other ) noexcept
    {
        for (auto i = other.size(); i > 0; ) {
            --i;
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(std::move(other[i]));
        }
        size_ = other.size();
    }